

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O2

bool __thiscall
ManifestParser::Parse(ManifestParser *this,string *filename,string *input,string *err)

{
  Lexer *this_00;
  StringPiece filename_00;
  StringPiece input_00;
  bool bVar1;
  bool bVar2;
  Token t;
  char *__rhs;
  string *this_01;
  string name;
  EvalString let_value;
  string value;
  
  this_01 = &name;
  this_00 = &(this->super_Parser).lexer_;
  filename_00.str_ = (filename->_M_dataplus)._M_p;
  filename_00.len_ = filename->_M_string_length;
  input_00.str_ = (input->_M_dataplus)._M_p;
  input_00.len_ = input->_M_string_length;
  Lexer::Start(this_00,filename_00,input_00);
switchD_00116283_caseD_8:
  t = Lexer::ReadToken(this_00);
  switch(t) {
  case ERROR:
    goto switchD_00116283_caseD_0;
  case BUILD:
    bVar2 = ParseEdge(this,err);
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,"unexpected ",(allocator<char> *)&let_value);
    __rhs = Lexer::TokenName(t);
    std::operator+(&name,&value,__rhs);
    bVar2 = Lexer::Error(this_00,&name,err);
    std::__cxx11::string::~string((string *)&name);
    this_01 = &value;
    goto LAB_00116437;
  case DEFAULT:
    bVar2 = ParseDefault(this,err);
    break;
  case IDENT:
    Lexer::UnreadToken(this_00);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    let_value.parsed_.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    let_value.parsed_.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    let_value.parsed_.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = ParseLet(this,&name,&let_value,err);
    if (!bVar2) {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
      ::~vector(&let_value.parsed_);
      std::__cxx11::string::~string((string *)&name);
      return false;
    }
    EvalString::Evaluate_abi_cxx11_(&value,&let_value,&this->env_->super_Env);
    bVar1 = std::operator==(&name,"ninja_required_version");
    if (bVar1) {
      CheckNinjaVersion(&value);
    }
    BindingEnv::AddBinding(this->env_,&name,&value);
    std::__cxx11::string::~string((string *)&value);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
    ::~vector(&let_value.parsed_);
    std::__cxx11::string::~string((string *)&name);
    if (!bVar2) {
      return false;
    }
    goto switchD_00116283_caseD_8;
  case INCLUDE:
    goto switchD_00116283_caseD_6;
  case NEWLINE:
    goto switchD_00116283_caseD_8;
  case POOL:
    bVar2 = ParsePool(this,err);
    break;
  case RULE:
    bVar2 = ParseRule(this,err);
    break;
  case SUBNINJA:
    bVar2 = ParseFileInclude(this,true,err);
    break;
  case TEOF:
    return true;
  }
  if (bVar2 == false) {
    return false;
  }
  goto switchD_00116283_caseD_8;
switchD_00116283_caseD_6:
  bVar2 = ParseFileInclude(this,false,err);
  if (!bVar2) {
    return false;
  }
  goto switchD_00116283_caseD_8;
switchD_00116283_caseD_0:
  Lexer::DescribeLastError_abi_cxx11_(&name,this_00);
  bVar2 = Lexer::Error(this_00,&name,err);
LAB_00116437:
  std::__cxx11::string::~string((string *)this_01);
  return bVar2;
}

Assistant:

bool ManifestParser::Parse(const string& filename, const string& input,
                           string* err) {
  lexer_.Start(filename, input);

  for (;;) {
    Lexer::Token token = lexer_.ReadToken();
    switch (token) {
    case Lexer::POOL:
      if (!ParsePool(err))
        return false;
      break;
    case Lexer::BUILD:
      if (!ParseEdge(err))
        return false;
      break;
    case Lexer::RULE:
      if (!ParseRule(err))
        return false;
      break;
    case Lexer::DEFAULT:
      if (!ParseDefault(err))
        return false;
      break;
    case Lexer::IDENT: {
      lexer_.UnreadToken();
      string name;
      EvalString let_value;
      if (!ParseLet(&name, &let_value, err))
        return false;
      string value = let_value.Evaluate(env_);
      // Check ninja_required_version immediately so we can exit
      // before encountering any syntactic surprises.
      if (name == "ninja_required_version")
        CheckNinjaVersion(value);
      env_->AddBinding(name, value);
      break;
    }
    case Lexer::INCLUDE:
      if (!ParseFileInclude(false, err))
        return false;
      break;
    case Lexer::SUBNINJA:
      if (!ParseFileInclude(true, err))
        return false;
      break;
    case Lexer::ERROR: {
      return lexer_.Error(lexer_.DescribeLastError(), err);
    }
    case Lexer::TEOF:
      return true;
    case Lexer::NEWLINE:
      break;
    default:
      return lexer_.Error(string("unexpected ") + Lexer::TokenName(token),
                          err);
    }
  }
  return false;  // not reached
}